

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppc.c
# Opt level: O1

uint64_t cpu_ppc_load_vtb_ppc64(CPUPPCState_conflict2 *env)

{
  ppc_tb_t *ppVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  long lVar4;
  
  ppVar1 = env->tb_env;
  uVar3 = qemu_clock_get_ns(QEMU_CLOCK_VIRTUAL);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar3;
  auVar2 = ZEXT416(ppVar1->tb_freq) * auVar2;
  lVar4 = __udivti3(auVar2._0_8_,auVar2._8_8_,1000000000,0);
  return lVar4 + ppVar1->vtb_offset;
}

Assistant:

uint64_t cpu_ppc_load_vtb(CPUPPCState *env)
{
    ppc_tb_t *tb_env = env->tb_env;

    return cpu_ppc_get_tb(tb_env, qemu_clock_get_ns(QEMU_CLOCK_VIRTUAL),
                          tb_env->vtb_offset);
}